

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

int __thiscall Mpp::poll(Mpp *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  MPP_RET MVar1;
  int iVar2;
  MppPort port;
  
  if (this->mInitDone == 0) {
    iVar2 = -0x3ea;
  }
  else {
    set_io_mode(this,MPP_IO_MODE_TASK);
    if ((int)__fds == 1) {
      port = this->mUsrOutPort;
    }
    else if ((int)__fds == 0) {
      port = this->mUsrInPort;
    }
    else {
      port = (MppPort)0x0;
    }
    if (port != (MppPort)0x0) {
      MVar1 = _mpp_port_poll("poll",port,(MppPollType)__nfds);
      return MVar1;
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

MPP_RET Mpp::poll(MppPortType type, MppPollType timeout)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
    } break;
    default : {
    } break;
    }

    if (port)
        ret = mpp_port_poll(port, timeout);

    return ret;
}